

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QTime __thiscall QLocale::toTime(QLocale *this,QString *string,FormatType format)

{
  long lVar1;
  QTime QVar2;
  undefined4 in_EDX;
  QString *in_RSI;
  QLocale *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  timeFormat((QLocale *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (FormatType)((ulong)in_RDI >> 0x20));
  QVar2 = toTime(in_RDI,in_RSI,(QString *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0));
  QString::~QString((QString *)0x4cf327);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QTime)QVar2.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QLocale::toTime(const QString &string, FormatType format) const
{
    return toTime(string, timeFormat(format));
}